

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree.c
# Opt level: O0

void xmlFreeDtd(xmlDtdPtr cur)

{
  _xmlNode *p_Var1;
  int iVar2;
  xmlDeregisterNodeFunc *pp_Var3;
  xmlNodePtr local_28;
  xmlNodePtr c;
  xmlNodePtr next;
  xmlDictPtr dict;
  xmlDtdPtr cur_local;
  
  next = (xmlNodePtr)0x0;
  if (cur != (xmlDtdPtr)0x0) {
    if (cur->doc != (_xmlDoc *)0x0) {
      next = (xmlNodePtr)cur->doc->dict;
    }
    if ((__xmlRegisterCallbacks != 0) &&
       (pp_Var3 = __xmlDeregisterNodeDefaultValue(), *pp_Var3 != (xmlDeregisterNodeFunc)0x0)) {
      pp_Var3 = __xmlDeregisterNodeDefaultValue();
      (**pp_Var3)((xmlNodePtr)cur);
    }
    if (cur->children != (_xmlNode *)0x0) {
      p_Var1 = cur->children;
      while (local_28 = p_Var1, local_28 != (xmlNodePtr)0x0) {
        p_Var1 = local_28->next;
        if ((((local_28->type != XML_NOTATION_NODE) && (local_28->type != XML_ELEMENT_DECL)) &&
            (local_28->type != XML_ATTRIBUTE_DECL)) && (local_28->type != XML_ENTITY_DECL)) {
          xmlUnlinkNode(local_28);
          xmlFreeNode(local_28);
        }
      }
    }
    if ((cur->name != (xmlChar *)0x0) &&
       ((next == (xmlNodePtr)0x0 || (iVar2 = xmlDictOwns((xmlDictPtr)next,cur->name), iVar2 == 0))))
    {
      (*xmlFree)(cur->name);
    }
    if ((cur->SystemID != (xmlChar *)0x0) &&
       ((next == (xmlNodePtr)0x0 ||
        (iVar2 = xmlDictOwns((xmlDictPtr)next,cur->SystemID), iVar2 == 0)))) {
      (*xmlFree)(cur->SystemID);
    }
    if ((cur->ExternalID != (xmlChar *)0x0) &&
       ((next == (xmlNodePtr)0x0 ||
        (iVar2 = xmlDictOwns((xmlDictPtr)next,cur->ExternalID), iVar2 == 0)))) {
      (*xmlFree)(cur->ExternalID);
    }
    if (cur->notations != (void *)0x0) {
      xmlFreeNotationTable((xmlNotationTablePtr)cur->notations);
    }
    if (cur->elements != (void *)0x0) {
      xmlFreeElementTable((xmlElementTablePtr)cur->elements);
    }
    if (cur->attributes != (void *)0x0) {
      xmlFreeAttributeTable((xmlAttributeTablePtr)cur->attributes);
    }
    if (cur->entities != (void *)0x0) {
      xmlFreeEntitiesTable((xmlEntitiesTablePtr)cur->entities);
    }
    if (cur->pentities != (void *)0x0) {
      xmlFreeEntitiesTable((xmlEntitiesTablePtr)cur->pentities);
    }
    (*xmlFree)(cur);
  }
  return;
}

Assistant:

void
xmlFreeDtd(xmlDtdPtr cur) {
    xmlDictPtr dict = NULL;

    if (cur == NULL) {
	return;
    }
    if (cur->doc != NULL) dict = cur->doc->dict;

    if ((__xmlRegisterCallbacks) && (xmlDeregisterNodeDefaultValue))
	xmlDeregisterNodeDefaultValue((xmlNodePtr)cur);

    if (cur->children != NULL) {
	xmlNodePtr next, c = cur->children;

	/*
	 * Cleanup all nodes which are not part of the specific lists
	 * of notations, elements, attributes and entities.
	 */
        while (c != NULL) {
	    next = c->next;
	    if ((c->type != XML_NOTATION_NODE) &&
	        (c->type != XML_ELEMENT_DECL) &&
		(c->type != XML_ATTRIBUTE_DECL) &&
		(c->type != XML_ENTITY_DECL)) {
		xmlUnlinkNode(c);
		xmlFreeNode(c);
	    }
	    c = next;
	}
    }
    DICT_FREE(cur->name)
    DICT_FREE(cur->SystemID)
    DICT_FREE(cur->ExternalID)
    /* TODO !!! */
    if (cur->notations != NULL)
        xmlFreeNotationTable((xmlNotationTablePtr) cur->notations);

    if (cur->elements != NULL)
        xmlFreeElementTable((xmlElementTablePtr) cur->elements);
    if (cur->attributes != NULL)
        xmlFreeAttributeTable((xmlAttributeTablePtr) cur->attributes);
    if (cur->entities != NULL)
        xmlFreeEntitiesTable((xmlEntitiesTablePtr) cur->entities);
    if (cur->pentities != NULL)
        xmlFreeEntitiesTable((xmlEntitiesTablePtr) cur->pentities);

    xmlFree(cur);
}